

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

void absl::lts_20240722::internal_statusor::Helper::HandleInvalidStatusCtorArg
               (Nonnull<absl::Status_*> status)

{
  int local_28 [2];
  char *local_20;
  char *absl_raw_log_internal_filename;
  char *kMessage;
  Nonnull<absl::Status_*> status_local;
  
  absl_raw_log_internal_filename = "An OK status is not a valid constructor argument to StatusOr<T>"
  ;
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/status/statusor.cc"
  ;
  local_28[1] = 3;
  local_28[0] = 0x4f;
  kMessage = (char *)status;
  base_internal::
  AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_28 + 1),
             &local_20,local_28,&absl_raw_log_internal_filename);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/status/statusor.cc"
                ,0x4f,
                "static void absl::internal_statusor::Helper::HandleInvalidStatusCtorArg(absl::Nonnull<absl::Status *>)"
               );
}

Assistant:

void Helper::HandleInvalidStatusCtorArg(absl::Nonnull<absl::Status*> status) {
  const char* kMessage =
      "An OK status is not a valid constructor argument to StatusOr<T>";
#ifdef NDEBUG
  ABSL_INTERNAL_LOG(ERROR, kMessage);
#else
  ABSL_INTERNAL_LOG(FATAL, kMessage);
#endif
  // In optimized builds, we will fall back to InternalError.
  *status = absl::InternalError(kMessage);
}